

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# do_wear.c
# Opt level: O1

int destroy_arm(obj *atmp,boolean already_dead)

{
  boolean bVar1;
  char *pcVar2;
  char *pcVar3;
  obj *poVar4;
  
  poVar4 = uarmc;
  if (((uarmc == (obj *)0x0) || (atmp != (obj *)0x0 && uarmc != atmp)) ||
     (bVar1 = obj_resists(uarmc,0,0x5a), bVar1 != '\0')) {
    poVar4 = uarm;
    if (((uarm == (obj *)0x0) || (atmp != (obj *)0x0 && uarm != atmp)) ||
       (bVar1 = obj_resists(uarm,0,0x5a), bVar1 != '\0')) {
      poVar4 = uarmu;
      if (((uarmu == (obj *)0x0) || (atmp != (obj *)0x0 && uarmu != atmp)) ||
         (bVar1 = obj_resists(uarmu,0,0x5a), bVar1 != '\0')) {
        poVar4 = uarmh;
        if (((uarmh == (obj *)0x0) || (atmp != (obj *)0x0 && uarmh != atmp)) ||
           (bVar1 = obj_resists(uarmh,0,0x5a), bVar1 != '\0')) {
          poVar4 = uarmg;
          if (((uarmg != (obj *)0x0) && (atmp == (obj *)0x0 || uarmg == atmp)) &&
             (bVar1 = obj_resists(uarmg,0,0x5a), bVar1 == '\0')) {
            bVar1 = donning_on(poVar4);
            if ((bVar1 != '\0') || (bVar1 = donning_off(poVar4), bVar1 != '\0')) {
              cancelled_don =
                   (afternmv == Armor_on || afternmv == Gloves_on) ||
                   (afternmv == Helmet_on || afternmv == Boots_on);
              afternmv = (_func_int *)0x0;
              nomovemsg = (char *)0x0;
              multi = 0;
              todelay = 0;
              taking_off = 0;
            }
            pline("Your gloves vanish!");
            Gloves_off();
            useup(poVar4);
            selftouch("You");
            goto LAB_00189b80;
          }
          poVar4 = uarmf;
          if (((uarmf == (obj *)0x0) || (atmp != (obj *)0x0 && uarmf != atmp)) ||
             (bVar1 = obj_resists(uarmf,0,0x5a), bVar1 != '\0')) {
            poVar4 = uarms;
            if (uarms == (obj *)0x0) {
              return 0;
            }
            if (atmp != (obj *)0x0 && uarms != atmp) {
              return 0;
            }
            bVar1 = obj_resists(uarms,0,0x5a);
            if (bVar1 != '\0') {
              return 0;
            }
            bVar1 = donning_on(poVar4);
            if ((bVar1 != '\0') || (bVar1 = donning_off(poVar4), bVar1 != '\0')) {
              cancelled_don =
                   (afternmv == Armor_on || afternmv == Gloves_on) ||
                   (afternmv == Helmet_on || afternmv == Boots_on);
              afternmv = (_func_int *)0x0;
              nomovemsg = (char *)0x0;
              multi = 0;
              todelay = 0;
              taking_off = 0;
            }
            pline("Your shield crumbles away!");
            Shield_off();
          }
          else {
            bVar1 = donning_on(poVar4);
            if ((bVar1 != '\0') || (bVar1 = donning_off(poVar4), bVar1 != '\0')) {
              cancelled_don =
                   (afternmv == Armor_on || afternmv == Gloves_on) ||
                   (afternmv == Helmet_on || afternmv == Boots_on);
              afternmv = (_func_int *)0x0;
              nomovemsg = (char *)0x0;
              multi = 0;
              todelay = 0;
              taking_off = 0;
            }
            pline("Your boots disintegrate!");
            Boots_off();
          }
        }
        else {
          bVar1 = donning_on(poVar4);
          if ((bVar1 != '\0') || (bVar1 = donning_off(poVar4), bVar1 != '\0')) {
            cancelled_don =
                 (afternmv == Armor_on || afternmv == Gloves_on) ||
                 (afternmv == Helmet_on || afternmv == Boots_on);
            afternmv = (_func_int *)0x0;
            nomovemsg = (char *)0x0;
            multi = 0;
            todelay = 0;
            taking_off = 0;
          }
          pline("Your helmet turns to dust and is blown away!");
          Helmet_off();
        }
      }
      else {
        bVar1 = donning_on(poVar4);
        if ((bVar1 != '\0') || (bVar1 = donning_off(poVar4), bVar1 != '\0')) {
          cancelled_don =
               (afternmv == Armor_on || afternmv == Gloves_on) ||
               (afternmv == Helmet_on || afternmv == Boots_on);
          afternmv = (_func_int *)0x0;
          nomovemsg = (char *)0x0;
          multi = 0;
          todelay = 0;
          taking_off = 0;
        }
        pline("Your shirt crumbles into tiny threads and falls apart!");
        Shirt_off();
      }
    }
    else {
      bVar1 = donning_on(poVar4);
      if ((bVar1 != '\0') || (bVar1 = donning_off(poVar4), bVar1 != '\0')) {
        cancelled_don =
             (afternmv == Armor_on || afternmv == Gloves_on) ||
             (afternmv == Helmet_on || afternmv == Boots_on);
        afternmv = (_func_int *)0x0;
        nomovemsg = (char *)0x0;
        multi = 0;
        todelay = 0;
        taking_off = 0;
      }
      pcVar2 = Ysimple_name2(poVar4);
      pcVar3 = surface((int)u.ux,(int)u.uy);
      pline("%s turns to dust and falls to the %s!",pcVar2,pcVar3);
      Armor_gone(already_dead);
    }
  }
  else {
    bVar1 = donning_on(poVar4);
    if ((bVar1 != '\0') || (bVar1 = donning_off(poVar4), bVar1 != '\0')) {
      cancelled_don =
           (afternmv == Armor_on || afternmv == Gloves_on) ||
           (afternmv == Helmet_on || afternmv == Boots_on);
      afternmv = (_func_int *)0x0;
      nomovemsg = (char *)0x0;
      multi = 0;
      todelay = 0;
      taking_off = 0;
    }
    pcVar2 = cloak_simple_name(uarmc);
    pline("Your %s crumbles and turns to dust!",pcVar2);
    Cloak_off();
  }
  useup(poVar4);
LAB_00189b80:
  stop_occupation();
  return 1;
}

Assistant:

int destroy_arm(struct obj *atmp, boolean already_dead)
{
	struct obj *otmp;
#define DESTROY_ARM(o) ((otmp = (o)) != 0 && \
			(!atmp || atmp == otmp) && \
			(!obj_resists(otmp, 0, 90)))

	if (DESTROY_ARM(uarmc)) {
		if (donning(otmp)) cancel_don();
		pline("Your %s crumbles and turns to dust!",
		     cloak_simple_name(uarmc));
		Cloak_off();
		useup(otmp);
	} else if (DESTROY_ARM(uarm)) {
		if (donning(otmp)) cancel_don();
		pline("%s turns to dust and falls to the %s!",
		      Ysimple_name2(otmp), surface(u.ux,u.uy));
		Armor_gone(already_dead);
		useup(otmp);
	} else if (DESTROY_ARM(uarmu)) {
		if (donning(otmp)) cancel_don();
		pline("Your shirt crumbles into tiny threads and falls apart!");
		Shirt_off();
		useup(otmp);
	} else if (DESTROY_ARM(uarmh)) {
		if (donning(otmp)) cancel_don();
		pline("Your helmet turns to dust and is blown away!");
		Helmet_off();
		useup(otmp);
	} else if (DESTROY_ARM(uarmg)) {
		if (donning(otmp)) cancel_don();
		pline("Your gloves vanish!");
		Gloves_off();
		useup(otmp);
		selftouch("You");
	} else if (DESTROY_ARM(uarmf)) {
		if (donning(otmp)) cancel_don();
		pline("Your boots disintegrate!");
		Boots_off();
		useup(otmp);
	} else if (DESTROY_ARM(uarms)) {
		if (donning(otmp)) cancel_don();
		pline("Your shield crumbles away!");
		Shield_off();
		useup(otmp);
	} else {
		return 0;		/* could not destroy anything */
	}

#undef DESTROY_ARM
	stop_occupation();
	return 1;
}